

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_2cfb1b::BuildSystemFileDelegate::cannotLoadDueToMultipleProducers
          (BuildSystemFileDelegate *this,Node *output,
          vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
          *commands)

{
  BuildSystemDelegate *pBVar1;
  _Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
  local_30;
  
  pBVar1 = this->system->delegate;
  std::vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>::
  vector((vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
          *)&local_30,commands);
  (*pBVar1->_vptr_BuildSystemDelegate[0x12])(pBVar1,output,&local_30);
  std::
  _Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>::
  ~_Vector_base(&local_30);
  return;
}

Assistant:

void
BuildSystemFileDelegate::cannotLoadDueToMultipleProducers(Node *output,
                                                          std::vector<Command*> commands) {
  getSystemDelegate().cannotBuildNodeDueToMultipleProducers(output, commands);
}